

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O0

int zap_hit_check(int ac,int type)

{
  bool bVar1;
  int iVar2;
  undefined4 local_24;
  undefined4 local_20;
  int spell_bonus;
  int chance;
  int type_local;
  int ac_local;
  
  iVar2 = rn2(0x14);
  if (type == 0) {
    local_20 = 0;
  }
  else {
    local_20 = spell_hit_bonus(type);
  }
  if (iVar2 == 0) {
    iVar2 = rnd(10);
    bVar1 = iVar2 < ac + local_20;
  }
  else {
    local_24 = ac;
    if (ac < 0) {
      local_24 = rnd(-ac);
      local_24 = -local_24;
    }
    bVar1 = 3 - iVar2 < local_24 + local_20;
  }
  type_local = (int)bVar1;
  return type_local;
}

Assistant:

static int zap_hit_check(int ac, 
		   int type)	/* either hero cast spell type or 0 */
{
    int chance = rn2(20);
    int spell_bonus = type ? spell_hit_bonus(type) : 0;

    /* small chance for naked target to avoid being hit */
    if (!chance) return rnd(10) < ac+spell_bonus;

    /* very high armor protection does not achieve invulnerability */
    ac = AC_VALUE(ac);

    return (3 - chance) < ac+spell_bonus;
}